

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

SectionTracker * Catch::TestCaseTracking::SectionTracker::acquire(TrackerContext *ctx,string *name)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ITracker *p;
  undefined4 extraout_var;
  int __oflag;
  Ptr<Catch::TestCaseTracking::ITracker> *in_RSI;
  TrackerContext *in_RDI;
  ITracker *childTracker;
  ITracker *currentTracker;
  SectionTracker *section;
  ITracker *in_stack_ffffffffffffffa8;
  TrackerContext *in_stack_ffffffffffffffb0;
  Ptr<Catch::TestCaseTracking::ITracker> *this;
  Ptr<Catch::TestCaseTracking::ITracker> in_stack_ffffffffffffffc0;
  TrackerBase *local_18;
  
  p = TrackerContext::currentTracker(in_RDI);
  iVar2 = (*(p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
            [0xe])();
  local_18 = (TrackerBase *)CONCAT44(extraout_var,iVar2);
  if (local_18 == (TrackerBase *)0x0) {
    local_18 = (TrackerBase *)operator_new(0x60);
    SectionTracker((SectionTracker *)in_stack_ffffffffffffffc0.m_p,(string *)local_18,
                   in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    in_RSI = (Ptr<Catch::TestCaseTracking::ITracker> *)&stack0xffffffffffffffc0;
    Ptr<Catch::TestCaseTracking::ITracker>::Ptr(in_RSI,p);
    this = in_RSI;
    (*(p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable[0xd])
              ();
    Ptr<Catch::TestCaseTracking::ITracker>::~Ptr(this);
  }
  bVar1 = TrackerContext::completedCycle(in_RDI);
  if ((!bVar1) &&
     (uVar3 = (*(local_18->super_ITracker).super_SharedImpl<Catch::IShared>.super_IShared.
                super_NonCopyable._vptr_NonCopyable[5])(), (uVar3 & 1) == 0)) {
    TrackerBase::open(local_18,(char *)in_RSI,__oflag);
  }
  return (SectionTracker *)local_18;
}

Assistant:

static SectionTracker& acquire( TrackerContext& ctx, std::string const& name ) {
            SectionTracker* section = CATCH_NULL;

            ITracker& currentTracker = ctx.currentTracker();
            if( ITracker* childTracker = currentTracker.findChild( name ) ) {
                assert( childTracker );
                assert( childTracker->isSectionTracker() );
                section = static_cast<SectionTracker*>( childTracker );
            }
            else {
                section = new SectionTracker( name, ctx, &currentTracker );
                currentTracker.addChild( section );
            }
            if( !ctx.completedCycle() && !section->isComplete() ) {

                section->open();
            }
            return *section;
        }